

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void duckdb::roaring::SetInvalidRange(ValidityMask *result,idx_t start,idx_t end)

{
  undefined8 uVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong in_RDX;
  ulong in_RSI;
  TemplatedValidityMask<unsigned_long> *in_RDI;
  idx_t entry_idx_2;
  validity_t mask_1;
  idx_t left_bits_1;
  idx_t bits_to_set_1;
  idx_t i;
  idx_t entry_idx;
  idx_t full_entries;
  idx_t remaining_bits;
  idx_t entry_idx_1;
  validity_t mask;
  idx_t left_bits;
  idx_t bits_to_set;
  idx_t right_bits;
  idx_t index;
  validity_t *result_data;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff30;
  allocator *paVar4;
  ulong local_a8;
  unsigned_long in_stack_ffffffffffffff68;
  unsigned_long in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  InternalException *in_stack_ffffffffffffff80;
  long local_78;
  long local_70;
  ulong local_60;
  allocator local_39;
  string local_38 [32];
  ulong local_18;
  ulong local_10;
  TemplatedValidityMask<unsigned_long> *local_8;
  
  if (in_RDX <= in_RSI) {
    uVar1 = __cxa_allocate_exception(0x10);
    paVar4 = &local_39;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_38,"SetInvalidRange called with end (%d) <= start (%d)",paVar4);
    InternalException::InternalException<unsigned_long,unsigned_long>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    __cxa_throw(uVar1,&InternalException::typeinfo,InternalException::~InternalException);
  }
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  TemplatedValidityMask<unsigned_long>::EnsureWritable(in_stack_ffffffffffffff30);
  puVar2 = TemplatedValidityMask<unsigned_long>::GetData(local_8);
  local_60 = local_10;
  if ((local_10 & 0x3f) != 0) {
    local_70 = 0x40 - (local_10 & 0x3f);
    local_78 = 0;
    if (local_18 < local_10 + local_70) {
      local_78 = (local_10 + local_70) - local_18;
      local_70 = local_18 - local_10;
    }
    uVar3 = *(ulong *)(ValidityUncompressed::LOWER_MASKS + (local_10 & 0x3f) * 8);
    if (local_78 != 0) {
      uVar3 = *(ulong *)(ValidityUncompressed::UPPER_MASKS + local_78 * 8) | uVar3;
    }
    local_60 = local_70 + local_10;
    puVar2[local_10 >> 6] = uVar3 & puVar2[local_10 >> 6];
  }
  for (local_a8 = 0; local_a8 < local_18 - local_60 >> 6; local_a8 = local_a8 + 1) {
    puVar2[(local_60 >> 6) + local_a8] = 0;
  }
  if ((local_18 - local_60 & 0x3f) != 0) {
    puVar2[local_18 >> 6] =
         *(ulong *)(ValidityUncompressed::UPPER_MASKS + (0x40 - (local_18 & 0x3f)) * 8) &
         puVar2[local_18 >> 6];
  }
  return;
}

Assistant:

void SetInvalidRange(ValidityMask &result, idx_t start, idx_t end) {
	if (end <= start) {
		throw InternalException("SetInvalidRange called with end (%d) <= start (%d)", end, start);
	}
	result.EnsureWritable();
	auto result_data = (validity_t *)result.GetData();

#ifdef DEBUG
	ValidityMask copy_for_verification(result.Capacity());
	copy_for_verification.EnsureWritable();
	for (idx_t i = 0;
	     i < AlignValue<idx_t, ValidityMask::BITS_PER_VALUE>(result.Capacity()) / ValidityMask::BITS_PER_VALUE; i++) {
		copy_for_verification.GetData()[i] = result.GetData()[i];
	}
#endif
	idx_t index = start;

	if ((index % ValidityMask::BITS_PER_VALUE) != 0) {
		// Adjust the high bits of the first entry

		// +======================================+
		// |xxxxxxxxxxxxxxxxxxxxxxxxx|            |
		// +======================================+
		//
		// 'x': bits to set to 0 in the result

		idx_t right_bits = index % ValidityMask::BITS_PER_VALUE;
		idx_t bits_to_set = ValidityMask::BITS_PER_VALUE - right_bits;
		idx_t left_bits = 0;
		if (index + bits_to_set > end) {
			// Limit the amount of bits to set
			left_bits = (index + bits_to_set) - end;
			bits_to_set = end - index;
		}

		// Prepare the mask
		validity_t mask = ValidityUncompressed::LOWER_MASKS[right_bits];
		if (left_bits) {
			// Mask off the part that we don't want to touch (if the range doesn't fully cover the bits)
			mask |= ValidityUncompressed::UPPER_MASKS[left_bits];
		}

		idx_t entry_idx = index / ValidityMask::BITS_PER_VALUE;
		index += bits_to_set;
		result_data[entry_idx] &= mask;
	}

	idx_t remaining_bits = end - index;
	idx_t full_entries = remaining_bits / ValidityMask::BITS_PER_VALUE;
	idx_t entry_idx = index / ValidityMask::BITS_PER_VALUE;
	// Set all the entries that are fully covered by the range to 0
	for (idx_t i = 0; i < full_entries; i++) {
		result_data[entry_idx + i] = (validity_t)0;
	}

	if ((remaining_bits % ValidityMask::BITS_PER_VALUE) != 0) {
		// The last entry touched by the range is only partially covered

		// +======================================+
		// |                         |xxxxxxxxxxxx|
		// +======================================+
		//
		// 'x': bits to set to 0 in the result

		idx_t bits_to_set = end % ValidityMask::BITS_PER_VALUE;
		idx_t left_bits = ValidityMask::BITS_PER_VALUE - bits_to_set;
		validity_t mask = ValidityUncompressed::UPPER_MASKS[left_bits];
		idx_t entry_idx = end / ValidityMask::BITS_PER_VALUE;
		result_data[entry_idx] &= mask;
	}

#ifdef DEBUG
	D_ASSERT(end <= result.Capacity());
	for (idx_t i = 0; i < result.Capacity(); i++) {
		if (i >= start && i < end) {
			D_ASSERT(!result.RowIsValidUnsafe(i));
		} else {
			// Ensure no others bits are touched by this method
			D_ASSERT(copy_for_verification.RowIsValidUnsafe(i) == result.RowIsValidUnsafe(i));
		}
	}
#endif
}